

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void __thiscall Fossilize::StateRecorder::Impl::push_work_locked(Impl *this,WorkItem *item)

{
  std::deque<Fossilize::WorkItem,_std::allocator<Fossilize::WorkItem>_>::push_back
            (&(this->record_queue).c,item);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void StateRecorder::Impl::push_work_locked(const WorkItem &item)
{
	record_queue.push(item);
	record_cv.notify_one();
}